

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

vector<duckdb::TemporaryFileInformation,_true> * __thiscall
duckdb::TemporaryFileManager::GetTemporaryFiles
          (vector<duckdb::TemporaryFileInformation,_true> *__return_storage_ptr__,
          TemporaryFileManager *this)

{
  temporary_file_map_t *ptVar1;
  pointer this_00;
  pointer pTVar2;
  __node_base *p_Var3;
  initializer_list<duckdb::TemporaryBufferSize> __l;
  allocator_type local_99;
  pthread_mutex_t *local_98;
  _Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_> local_90;
  TemporaryFileInformation local_78;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_98 = (pthread_mutex_t *)&this->manager_lock;
  ::std::mutex::lock((mutex *)&local_98->__data);
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0x38000;
  uStack_40 = 0x40000;
  local_78.size = 0x28000;
  uStack_50 = 0x30000;
  local_78.path.field_2._M_allocated_capacity = 0x18000;
  local_78.path.field_2._8_8_ = 0x20000;
  local_78.path._M_dataplus._M_p = (pointer)0x8000;
  local_78.path._M_string_length = 0x10000;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_78;
  ::std::vector<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>::vector
            ((vector<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_> *)
             &local_90,__l,&local_99);
  for (pTVar2 = local_90._M_impl.super__Vector_impl_data._M_start;
      pTVar2 != local_90._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    ptVar1 = TemporaryFileMap::GetMapForSize(&this->files,*pTVar2);
    p_Var3 = &(ptVar1->_M_h)._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      this_00 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                ::operator->((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                              *)(p_Var3 + 2));
      TemporaryFileHandle::GetTemporaryFile(&local_78,this_00);
      ::std::
      vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>::
      emplace_back<duckdb::TemporaryFileInformation>
                (&__return_storage_ptr__->
                  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
                 ,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
  }
  ::std::_Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>::
  ~_Vector_base(&local_90);
  pthread_mutex_unlock(local_98);
  return __return_storage_ptr__;
}

Assistant:

vector<TemporaryFileInformation> TemporaryFileManager::GetTemporaryFiles() {
	lock_guard<mutex> lock(manager_lock);
	vector<TemporaryFileInformation> result;
	for (auto &size : TemporaryBufferSizes()) {
		for (const auto &file : files.GetMapForSize(size)) {
			result.push_back(file.second->GetTemporaryFile());
		}
	}
	return result;
}